

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElementTable.h
# Opt level: O0

ImaginaryIntegerConstant * __thiscall
psy::TextElementTable<psy::C::ImaginaryIntegerConstant>::findOrInsert
          (TextElementTable<psy::C::ImaginaryIntegerConstant> *this,char *chars,uint size)

{
  int iVar1;
  uint uVar2;
  ImaginaryIntegerConstant **ppIVar3;
  uint h;
  ImaginaryIntegerConstant *elem;
  uint size_local;
  char *chars_local;
  TextElementTable<psy::C::ImaginaryIntegerConstant> *this_local;
  
  this_local = (TextElementTable<psy::C::ImaginaryIntegerConstant> *)find(this,chars,size);
  if (this_local == (TextElementTable<psy::C::ImaginaryIntegerConstant> *)0x0) {
    iVar1 = this->count_ + 1;
    this->count_ = iVar1;
    if (iVar1 == this->allocated_) {
      if (this->allocated_ == 0) {
        this->allocated_ = 4;
      }
      else {
        this->allocated_ = this->allocated_ << 1;
      }
      ppIVar3 = (ImaginaryIntegerConstant **)realloc(this->elements_,(long)this->allocated_ << 3);
      this->elements_ = ppIVar3;
    }
    this_local = (TextElementTable<psy::C::ImaginaryIntegerConstant> *)operator_new(0x30);
    C::ImaginaryIntegerConstant::ImaginaryIntegerConstant
              ((ImaginaryIntegerConstant *)this_local,chars,size);
    this->elements_[this->count_] = (ImaginaryIntegerConstant *)this_local;
    if ((this->buckets_ == (ImaginaryIntegerConstant **)0x0) ||
       (iVar1 = this->count_ * 5,
       SBORROW4(iVar1,this->bucketCount_ * 3) == iVar1 + this->bucketCount_ * -3 < 0)) {
      rehash(this);
    }
    else {
      uVar2 = TextElement::hashCode((TextElement *)this_local);
      uVar2 = uVar2 % (uint)this->bucketCount_;
      this_local[1].elements_ = (ImaginaryIntegerConstant **)this->buckets_[uVar2];
      this->buckets_[uVar2] = (ImaginaryIntegerConstant *)this_local;
    }
  }
  return (ImaginaryIntegerConstant *)this_local;
}

Assistant:

const ElemT* findOrInsert(const char *chars, unsigned int size)
    {
        ElemT* elem = const_cast<ElemT*>(find(chars, size));
        if (elem)
            return elem;

        if (++count_ == allocated_) {
            if (!allocated_)
                allocated_ = 4;
            else
                allocated_ <<= 1;
            elements_ = (ElemT**) std::realloc(elements_, sizeof(ElemT*)* allocated_);
        }

        elem = new ElemT(chars, size);
        elements_[count_] = elem;

        if (!buckets_ || count_ * 5 >= bucketCount_ * 3)
            rehash();
        else {
            unsigned h = elem->hashCode() % bucketCount_;
            elem ->next_ = buckets_[h];
            buckets_[h] = elem;
        }

        return elem;
    }